

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_disk_io.cpp
# Opt level: O2

bool __thiscall
libtorrent::posix_disk_io::async_write
          (posix_disk_io *this,storage_index_t storage,peer_request *r,char *buf,
          shared_ptr<libtorrent::disk_observer> *param_4,
          function<void_(const_libtorrent::storage_error_&)> *handler,disk_job_flags_t param_6)

{
  int iVar1;
  io_context *ctx;
  _Manager_type p_Var2;
  long lVar3;
  long lVar4;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  undefined8 local_68;
  error_category *peStack_60;
  undefined3 local_58;
  operation_t oStack_55;
  storage_error error;
  
  iVar1 = r->length;
  lVar3 = ::std::chrono::_V2::system_clock::now();
  error.ec.val_ = 0;
  error.ec._4_4_ = error.ec._4_4_ & 0xffffff00;
  error.ec.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  error._16_3_ = 0xffffff;
  error.operation = unknown;
  aux::posix_storage::write
            ((posix_storage *)
             (this->m_torrents).
             super_vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
             .
             super__Vector_base<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[storage.m_val]._M_t.
             super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
             ,(int)this->m_settings,buf,(long)iVar1);
  if (error.ec.failed_ == false) {
    lVar4 = ::std::chrono::_V2::system_clock::now();
    lVar3 = (lVar4 - lVar3) / 1000;
    counters::inc_stats_counter(this->m_stats_counters,0x6f,1);
    counters::inc_stats_counter(this->m_stats_counters,0x72,1);
    counters::inc_stats_counter(this->m_stats_counters,0x76,lVar3);
    counters::inc_stats_counter(this->m_stats_counters,0x78,lVar3);
  }
  ctx = this->m_ios;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (_Manager_type)0x0;
  local_70 = handler->_M_invoker;
  p_Var2 = (handler->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_88._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(handler->super__Function_base)._M_functor;
    local_88._8_8_ = *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
    local_78 = p_Var2;
  }
  local_58 = error._16_3_;
  oStack_55 = error.operation;
  local_68 = CONCAT44(error.ec._4_4_,error.ec.val_);
  peStack_60 = error.ec.cat_;
  boost::asio::
  post<boost::asio::io_context,libtorrent::posix_disk_io::async_write(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::peer_request_const&,char_const*,std::shared_ptr<libtorrent::disk_observer>,std::function<void(libtorrent::storage_error_const&)>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_job_flags_tag,void>)::_lambda()_1_>
            (ctx,(type *)&local_88,(type *)0x0);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_88);
  return false;
}

Assistant:

bool async_write(storage_index_t storage, peer_request const& r
			, char const* buf, std::shared_ptr<disk_observer>
			, std::function<void(storage_error const&)> handler
			, disk_job_flags_t) override
		{
			span<char> const b = { const_cast<char*>(buf), r.length };

			time_point const start_time = clock_type::now();

			storage_error error;
			m_torrents[storage]->write(m_settings, b, r.piece, r.start, error);

			if (!error.ec)
			{
				std::int64_t const write_time = total_microseconds(clock_type::now() - start_time);

				m_stats_counters.inc_stats_counter(counters::num_blocks_written);
				m_stats_counters.inc_stats_counter(counters::num_write_ops);
				m_stats_counters.inc_stats_counter(counters::disk_write_time, write_time);
				m_stats_counters.inc_stats_counter(counters::disk_job_time, write_time);
			}

			post(m_ios, [=, h = std::move(handler)]{ h(error); });
			return false;
		}